

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssimpCExport.cpp
# Opt level: O2

void aiCopyScene(aiScene *pIn,aiScene **pOut)

{
  ScenePrivateData *pSVar1;
  
  if (pIn != (aiScene *)0x0 && pOut != (aiScene **)0x0) {
    Assimp::SceneCombiner::CopyScene(pOut,pIn,true);
    pSVar1 = Assimp::ScenePriv(*pOut);
    pSVar1->mIsCopy = true;
  }
  return;
}

Assistant:

ASSIMP_API void aiCopyScene(const aiScene* pIn, aiScene** pOut)
{
    if (!pOut || !pIn) {
        return;
    }

    SceneCombiner::CopyScene(pOut,pIn,true);
    ScenePriv(*pOut)->mIsCopy = true;
}